

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O0

void anon_unknown.dwarf_4289b::reportTypeMismatch(bool *valid,char *kind,Importable *import)

{
  ostream *poVar1;
  ostream *poVar2;
  Name name;
  Name name_00;
  Name name_01;
  Importable *import_local;
  char *kind_local;
  bool *valid_local;
  
  *valid = false;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Type mismatch when importing ");
  poVar1 = std::operator<<(poVar1,kind);
  poVar2 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)(import->base).super_IString.str._M_len;
  name.super_IString.str._M_str = (char *)poVar1;
  name.super_IString.str._M_len = (size_t)(import->base).super_IString.str._M_str;
  poVar1 = wasm::operator<<((wasm *)poVar2,poVar1,name);
  poVar2 = std::operator<<(poVar1," from module ");
  poVar1 = (ostream *)(import->module).super_IString.str._M_len;
  name_00.super_IString.str._M_str = (char *)poVar1;
  name_00.super_IString.str._M_len = (size_t)(import->module).super_IString.str._M_str;
  poVar1 = wasm::operator<<((wasm *)poVar2,poVar1,name_00);
  poVar2 = std::operator<<(poVar1," ($");
  poVar1 = (ostream *)(import->super_Named).name.super_IString.str._M_len;
  name_01.super_IString.str._M_str = (char *)poVar1;
  name_01.super_IString.str._M_len = (size_t)(import->super_Named).name.super_IString.str._M_str;
  poVar1 = wasm::operator<<((wasm *)poVar2,poVar1,name_01);
  std::operator<<(poVar1,"): ");
  return;
}

Assistant:

void reportTypeMismatch(bool& valid, const char* kind, Importable* import) {
  valid = false;
  std::cerr << "Type mismatch when importing " << kind << " " << import->base
            << " from module " << import->module << " ($" << import->name
            << "): ";
}